

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cpp
# Opt level: O2

string * __thiscall
cali::util::demangle_abi_cxx11_(string *__return_storage_ptr__,util *this,char *name)

{
  void *__ptr;
  int status;
  int local_1c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this == (util *)0x0) {
    return __return_storage_ptr__;
  }
  local_1c = -1;
  if ((*this == (util)0x5f) && (this[1] == (util)0x5a)) {
    __ptr = (void *)__cxa_demangle(this,0,0,&local_1c);
    if (local_1c == 0) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      goto LAB_001c057f;
    }
  }
  else {
    __ptr = (void *)0x0;
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_001c057f:
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char* name)
{
#ifdef _WIN32
    // not sure how to demangle on Windows, make it a no-op for now.
    return name;
#else
    std::string result;

    if (!name)
        return result;

    char* demangled = nullptr;
    int   status    = -1;

    if (name[0] == '_' && name[1] == 'Z')
        demangled = abi::__cxa_demangle(name, nullptr, 0, &status);

    if (status == 0)
        result = demangled;
    else
        result = name;

    free(demangled);

    return result;
#endif
}